

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O0

RK_U32 h265e_data_to_sei(void *dst,RK_U8 *uuid,void *payload,RK_S32 size)

{
  int iVar1;
  RK_U8 *end;
  H265eStream stream;
  H265eNal sei_nal;
  RK_S32 size_local;
  void *payload_local;
  RK_U8 *uuid_local;
  void *dst_local;
  
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_data_to_sei");
  }
  h265e_stream_init((H265eStream *)&end);
  memset(&stream.enc_stream.emul_cnt,0,0x30);
  stream.enc_stream._44_4_ = 0x27;
  iVar1 = (int)end + stream.enc_stream.stream._4_4_;
  h265e_sei_write((H265eStream *)&end,uuid,(RK_U8 *)payload,size,5);
  h265e_nal_encode((RK_U8 *)dst,(H265eNal *)&stream.enc_stream.emul_cnt);
  h265e_stream_deinit((H265eStream *)&end);
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_data_to_sei");
  }
  return ((int)end + stream.enc_stream.stream._4_4_) - iVar1;
}

Assistant:

RK_U32 h265e_data_to_sei(void *dst, RK_U8 uuid[16], const void *payload, RK_S32 size)
{
    H265eNal sei_nal;
    H265eStream stream;

    h265e_dbg_func("enter\n");

    h265e_stream_init(&stream);
    memset(&sei_nal, 0 , sizeof(H265eNal));

    sei_nal.i_type = NAL_SEI_PREFIX;
    sei_nal.p_payload = &stream.buf[stream.enc_stream.byte_cnt];

    h265e_sei_write(&stream, uuid, payload, size, H265_SEI_USER_DATA_UNREGISTERED);

    RK_U8 *end = &stream.buf[stream.enc_stream.byte_cnt];
    sei_nal.i_payload = (RK_S32)(end - sei_nal.p_payload);

    h265e_nal_encode(dst, &sei_nal);

    h265e_stream_deinit(&stream);

    h265e_dbg_func("leave\n");
    return sei_nal.i_payload;
}